

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int Cudd_ShuffleHeap(DdManager *table,int *permutation)

{
  bool bVar1;
  int iVar2;
  int *perm_00;
  int *perm;
  int local_28;
  int identity;
  int i;
  int result;
  int *permutation_local;
  DdManager *table_local;
  
  bVar1 = true;
  local_28 = 0;
  do {
    if (table->size <= local_28) {
LAB_00a67982:
      if (bVar1) {
        table_local._4_4_ = 1;
      }
      else {
        iVar2 = ddReorderPreprocess(table);
        if (iVar2 == 0) {
          table_local._4_4_ = 0;
        }
        else {
          if (table->peakLiveNodes < table->keys) {
            table->peakLiveNodes = table->keys;
          }
          perm_00 = (int *)malloc((long)table->size << 2);
          for (local_28 = 0; local_28 < table->size; local_28 = local_28 + 1) {
            perm_00[permutation[local_28]] = local_28;
          }
          iVar2 = ddCheckPermuation(table,table->tree,perm_00,permutation);
          if (iVar2 == 0) {
            if (perm_00 != (int *)0x0) {
              free(perm_00);
            }
            table_local._4_4_ = 0;
          }
          else {
            iVar2 = ddUpdateMtrTree(table,table->tree,perm_00,permutation);
            if (iVar2 == 0) {
              if (perm_00 != (int *)0x0) {
                free(perm_00);
              }
              table_local._4_4_ = 0;
            }
            else {
              if (perm_00 != (int *)0x0) {
                free(perm_00);
              }
              table_local._4_4_ = ddShuffle(table,permutation);
              iVar2 = ddReorderPostprocess(table);
              if (iVar2 == 0) {
                table_local._4_4_ = 0;
              }
            }
          }
        }
      }
      return table_local._4_4_;
    }
    if (permutation[local_28] != table->invperm[local_28]) {
      bVar1 = false;
      goto LAB_00a67982;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int
Cudd_ShuffleHeap(
  DdManager * table /* DD manager */,
  int * permutation /* required variable permutation */)
{

    int result;
    int i;
    int identity = 1;
    int *perm;

    /* Don't waste time in case of identity permutation. */
    for (i = 0; i < table->size; i++) {
        if (permutation[i] != table->invperm[i]) {
            identity = 0;
            break;
        }
    }
    if (identity == 1) {
        return(1);
    }
    if (!ddReorderPreprocess(table)) return(0);
    if (table->keys > table->peakLiveNodes) {
        table->peakLiveNodes = table->keys;
    }

    perm = ABC_ALLOC(int, table->size);
    for (i = 0; i < table->size; i++)
        perm[permutation[i]] = i;
    if (!ddCheckPermuation(table,table->tree,perm,permutation)) {
        ABC_FREE(perm);
        return(0);
    }
    if (!ddUpdateMtrTree(table,table->tree,perm,permutation)) {
        ABC_FREE(perm);
        return(0);
    }
    ABC_FREE(perm);

    result = ddShuffle(table,permutation);

    if (!ddReorderPostprocess(table)) return(0);

    return(result);

}